

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

void ParseSpawnMap(FScanner *sc,SpawnMap *themap,char *descript)

{
  uint key;
  bool bVar1;
  bool *pbVar2;
  bool *def;
  int ednum;
  undefined1 local_58 [8];
  MapinfoSpawnItem editem;
  undefined1 local_38 [4];
  int error;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> defined;
  char *descript_local;
  SpawnMap *themap_local;
  FScanner *sc_local;
  
  defined._16_8_ = descript;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::TMap
            ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_38);
  editem._20_4_ = 0;
  MapinfoSpawnItem::MapinfoSpawnItem((MapinfoSpawnItem *)local_58);
  FString::operator=((FString *)&editem,&sc->ScriptName);
  while (bVar1 = FScanner::CheckString(sc,"}"), !bVar1) {
    bVar1 = FScanner::CheckNumber(sc);
    if (bVar1) {
      key = sc->Number;
      FScanner::MustGetStringName(sc,"=");
      FScanner::MustGetString(sc);
      pbVar2 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CheckKey
                         ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_38,key);
      if (pbVar2 == (bool *)0x0) {
        if ((int)key < 0) {
          FScanner::ScriptMessage(sc,"%s must be positive, got %d",defined._16_8_,(ulong)key);
          editem._20_4_ = editem._20_4_ + 1;
        }
      }
      else {
        FScanner::ScriptMessage(sc,"%s %d defined more than once",defined._16_8_,(ulong)key);
        editem._20_4_ = editem._20_4_ + 1;
      }
      pbVar2 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::operator[]
                         ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_38,key);
      *pbVar2 = true;
      FName::operator=((FName *)local_58,sc->String);
      editem.filename.Chars._0_4_ = sc->Line;
      TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Insert
                (themap,key,(MapinfoSpawnItem *)local_58);
    }
    else {
      FScanner::ScriptError(sc,"Number expected");
    }
  }
  MapinfoSpawnItem::~MapinfoSpawnItem((MapinfoSpawnItem *)local_58);
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::~TMap
            ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_38);
  return;
}

Assistant:

static void ParseSpawnMap(FScanner &sc, SpawnMap & themap, const char *descript)
{
	TMap<int, bool> defined;
	int error = 0;

	MapinfoSpawnItem editem;

	editem.filename = sc.ScriptName;

	while (true)
	{
		if (sc.CheckString("}")) return;
		else if (sc.CheckNumber())
		{
			int ednum = sc.Number;
			sc.MustGetStringName("=");
			sc.MustGetString();

			bool *def = defined.CheckKey(ednum);
			if (def != NULL)
			{
				sc.ScriptMessage("%s %d defined more than once", descript, ednum);
				error++;
			}
			else if (ednum < 0)
			{
				sc.ScriptMessage("%s must be positive, got %d", descript, ednum);
				error++;
			}
			defined[ednum] = true;
			editem.classname = sc.String;
			editem.linenum = sc.Line;

			themap.Insert(ednum, editem);
		}
		else
		{
			sc.ScriptError("Number expected");
		}
	}
	if (error > 0)
	{
		sc.ScriptError("%d errors encountered in %s definition", error, descript);
	}
}